

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_miniz.h
# Opt level: O0

int buminiz::mz_uncompress(uchar *pDest,mz_ulong *pDest_len,uchar *pSource,mz_ulong source_len)

{
  int iVar1;
  ulong in_RCX;
  undefined8 in_RDX;
  ulong *in_RSI;
  undefined8 in_RDI;
  int status;
  mz_stream stream;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff60;
  undefined8 local_98;
  int local_90;
  undefined8 local_80;
  undefined4 local_78;
  ulong local_70;
  ulong local_28;
  undefined8 local_20;
  ulong *local_18;
  undefined8 local_10;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_98,0,0x70);
  if ((local_28 | *local_18) < 0x100000000) {
    local_98 = local_20;
    local_90 = (int)local_28;
    local_80 = local_10;
    local_78 = (undefined4)*local_18;
    local_4 = mz_inflateInit((mz_streamp)0x126f24);
    if (local_4 == 0) {
      iVar1 = mz_inflate((mz_streamp)(ulong)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      if (iVar1 == 1) {
        *local_18 = local_70;
        local_4 = mz_inflateEnd((mz_streamp)
                                CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      else {
        mz_inflateEnd((mz_streamp)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        local_4 = iVar1;
        if ((iVar1 == -5) && (local_90 == 0)) {
          local_4 = -3;
        }
      }
    }
  }
  else {
    local_4 = -10000;
  }
  return local_4;
}

Assistant:

int mz_uncompress(unsigned char *pDest, mz_ulong *pDest_len, const unsigned char *pSource, mz_ulong source_len)
{
  mz_stream stream;
  int status;
  memset(&stream, 0, sizeof(stream));

  // In case mz_ulong is 64-bits (argh I hate longs).
  if ((source_len | *pDest_len) > 0xFFFFFFFFU) return MZ_PARAM_ERROR;

  stream.next_in = pSource;
  stream.avail_in = (mz_uint32)source_len;
  stream.next_out = pDest;
  stream.avail_out = (mz_uint32)*pDest_len;

  status = mz_inflateInit(&stream);
  if (status != MZ_OK)
    return status;

  status = mz_inflate(&stream, MZ_FINISH);
  if (status != MZ_STREAM_END)
  {
    mz_inflateEnd(&stream);
    return ((status == MZ_BUF_ERROR) && (!stream.avail_in)) ? MZ_DATA_ERROR : status;
  }
  *pDest_len = stream.total_out;

  return mz_inflateEnd(&stream);
}